

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint getHash(uchar *data,size_t size,size_t pos)

{
  size_t i;
  size_t amount;
  uint result;
  size_t pos_local;
  size_t size_local;
  uchar *data_local;
  
  result = 0;
  if (pos + 2 < size) {
    result = (uint)data[pos + 2] << 8 ^ (uint)data[pos + 1] << 4 ^ (uint)data[pos];
  }
  else {
    if (size <= pos) {
      return 0;
    }
    for (i = 0; i != size - pos; i = i + 1) {
      result = (uint)data[pos + i] << ((byte)(i << 3) & 0x1f) ^ result;
    }
  }
  return result & 0xffff;
}

Assistant:

static unsigned getHash(const unsigned char* data, size_t size, size_t pos) {
  unsigned result = 0;
  if(pos + 2 < size) {
    /*A simple shift and xor hash is used. Since the data of PNGs is dominated
    by zeroes due to the filters, a better hash does not have a significant
    effect on speed in traversing the chain, and causes more time spend on
    calculating the hash.*/
    result ^= (unsigned)(data[pos + 0] << 0u);
    result ^= (unsigned)(data[pos + 1] << 4u);
    result ^= (unsigned)(data[pos + 2] << 8u);
  } else {
    size_t amount, i;
    if(pos >= size) return 0;
    amount = size - pos;
    for(i = 0; i != amount; ++i) result ^= (unsigned)(data[pos + i] << (i * 8u));
  }
  return result & HASH_BIT_MASK;
}